

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

void __thiscall CInput::ProcessSystemMessage(CInput *this,SDL_SysWMmsg *pMsg)

{
  return;
}

Assistant:

void CInput::ProcessSystemMessage(SDL_SysWMmsg *pMsg)
{
#if defined(CONF_FAMILY_WINDOWS)
	// Todo SDL: remove this after SDL2 supports IME candidates
	if(pMsg->subsystem == SDL_SYSWM_WINDOWS)
	{
		if(pMsg->msg.win.msg != WM_IME_NOTIFY)
			return;

		switch(pMsg->msg.win.wParam)
		{
			case IMN_OPENCANDIDATE:
			case IMN_CHANGECANDIDATE:
			{
				HWND WindowHandle = pMsg->msg.win.hwnd;
				HIMC ImeContext = ImmGetContext(WindowHandle);
				DWORD CandidateCount;
				DWORD Size = ImmGetCandidateListCountW(ImeContext, &CandidateCount);
				LPCANDIDATELIST CandidateList = NULL;
				if(Size > 0)
				{
					CandidateList = (LPCANDIDATELIST)mem_alloc(Size);
					Size = ImmGetCandidateListW(ImeContext, 0, CandidateList, Size);
				}
				if(CandidateList && Size > 0)
				{
					m_CandidateCount = 0;
					for(DWORD i = CandidateList->dwPageStart; i < CandidateList->dwCount && m_CandidateCount < (int)CandidateList->dwPageSize; i++)
					{
						LPCWSTR Candidate = (LPCWSTR)((DWORD_PTR)CandidateList + CandidateList->dwOffset[i]);
						WideCharToMultiByte(CP_UTF8, 0, Candidate, -1, m_aaCandidates[m_CandidateCount], MAX_CANDIDATE_ARRAY_SIZE, "?", NULL);
						m_aaCandidates[m_CandidateCount][MAX_CANDIDATE_ARRAY_SIZE - 1] = '\0';
						m_CandidateCount++;
					}
					m_CandidateSelectedIndex = CandidateList->dwSelection - CandidateList->dwPageStart;
				}
				else
				{
					m_CandidateCount = 0;
					m_CandidateSelectedIndex = -1;
				}
				mem_free(CandidateList);
				ImmReleaseContext(WindowHandle, ImeContext);
				break;
			}
			case IMN_CLOSECANDIDATE:
				m_CandidateCount = 0;
				m_CandidateSelectedIndex = -1;
				break;
		}
	}
#endif
}